

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O3

void __thiscall
embree::InstanceArray::updateBuffer(InstanceArray *this,RTCBufferType type,uint slot)

{
  uint *puVar1;
  RawBufferView *pRVar2;
  ulong uVar3;
  RawBufferView *pRVar4;
  undefined8 *puVar5;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (type == RTC_BUFFER_TYPE_INDEX) {
    if (slot != 0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"invalid index buffer slot. must be 0","");
      *puVar5 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar5 + 1) = 2;
      puVar5[2] = puVar5 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    puVar1 = &(this->object_ids).super_RawBufferView.modCounter;
    *puVar1 = *puVar1 + 1;
    pRVar4 = &(this->object_ids).super_RawBufferView;
  }
  else {
    if (type != RTC_BUFFER_TYPE_TRANSFORM) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unknown buffer type","");
      *puVar5 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar5 + 1) = 2;
      puVar5[2] = puVar5 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    uVar3 = (ulong)slot;
    if ((this->l2w_buf).size_active <= uVar3) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"invalid transform buffer slot","");
      *puVar5 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar5 + 1) = 2;
      puVar5[2] = puVar5 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar2 = (this->l2w_buf).items;
    pRVar4 = pRVar2 + uVar3;
    puVar1 = &pRVar2[uVar3].modCounter;
    *puVar1 = *puVar1 + 1;
  }
  pRVar4->modified = true;
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void InstanceArray::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type == RTC_BUFFER_TYPE_TRANSFORM)
    {
      if (slot >= l2w_buf.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid transform buffer slot");
      l2w_buf[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid index buffer slot. must be 0");
      object_ids.setModified();
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }